

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::ColumnCryptoMetaData::ColumnCryptoMetaData(ColumnCryptoMetaData *this)

{
  *(undefined ***)this = &PTR__ColumnCryptoMetaData_027dc7e8;
  this->ENCRYPTION_WITH_FOOTER_KEY = (EncryptionWithFooterKey)&PTR__EncryptionWithFooterKey_027dc718
  ;
  EncryptionWithColumnKey::EncryptionWithColumnKey(&this->ENCRYPTION_WITH_COLUMN_KEY);
  this->__isset = (_ColumnCryptoMetaData__isset)((byte)this->__isset & 0xfc);
  return;
}

Assistant:

ColumnCryptoMetaData::ColumnCryptoMetaData() noexcept {
}